

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O2

Result * CoreML::validateNdMultiArrayInputType
                   (Result *__return_storage_ptr__,ArrayFeatureType *arrayType)

{
  int iVar1;
  ArrayFeatureType_ShapeRange *pAVar2;
  allocator local_31;
  string local_30;
  
  iVar1 = (arrayType->shape_).current_size_;
  if (iVar1 < 1) {
    std::__cxx11::string::string
              ((string *)&local_30,
               "Input MLMultiArray to neural networks must have at least 1 dimension.",&local_31);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
LAB_00561a9f:
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    if (arrayType->_oneof_case_[0] == 0x1f) {
      pAVar2 = Specification::ArrayFeatureType::shaperange(arrayType);
      if ((pAVar2->sizeranges_).super_RepeatedPtrFieldBase.current_size_ != iVar1) {
        std::__cxx11::string::string
                  ((string *)&local_30,
                   "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape."
                   ,&local_31);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
        goto LAB_00561a9f;
      }
    }
    Result::Result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateNdMultiArrayInputType(const Specification::ArrayFeatureType& arrayType)
{
    auto rank = arrayType.shape().size();
    if (!(rank > 0)) {
        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have at least 1 dimension.");
    }
    switch (arrayType.ShapeFlexibility_case()) {
        case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
            break;
        case CoreML::Specification::ArrayFeatureType::kShapeRange:
            if (arrayType.shaperange().sizeranges_size() != rank) {
                return Result(ResultType::INVALID_MODEL_INTERFACE, "For MLMultiArray input: Rank of the flexible shape range must match the rank of the default shape.");
                break;
            }
        case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
            break;
    }

    return Result();
}